

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvers.h
# Opt level: O3

void __thiscall
dlib::sgd::update_considering_bias<dlib::con_<2048l,1l,1l,1,1,0,0>>
          (sgd *this,float learning_rate,con_<2048L,_1L,_1L,_1,_1,_0,_0> *l,tensor *params_grad,
          unsigned_long bias_offset)

{
  uint *puVar1;
  long lVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int iVar7;
  undefined4 extraout_var;
  ostream *poVar8;
  fatal_error *this_00;
  undefined1 auVar9 [16];
  float B;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  ostringstream dlib_o_out;
  string local_1c0;
  long local_1a0 [3];
  uint auStack_188 [88];
  
  if ((l->params).super_tensor.m_size == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,"\n\nError detected at line ",0x19);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,0x9f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,".\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,"Error detected in file ",0x17);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/../dlib/dnn/solvers.h"
               ,0x7b);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,".\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,"Error detected in function ",0x1b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,
               "void dlib::sgd::update_considering_bias(const float, const layer_type &, const tensor &, unsigned long) [layer_type = dlib::con_<2048, 1, 1, 1, 1>]"
               ,0x93);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,".\n\n",3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,"Failing expression was ",0x17);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,"params.size() != 0",0x12);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,".\n",2);
    puVar1 = (uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18));
    *puVar1 = *puVar1 | 1;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"",0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"\n",1);
    this_00 = (fatal_error *)__cxa_allocate_exception(0x30);
    std::__cxx11::stringbuf::str();
    fatal_error::fatal_error(this_00,EBROKEN_ASSERT,&local_1c0);
    __cxa_throw(this_00,&fatal_error::typeinfo,error::~error);
  }
  if ((this->v).super_tensor.m_size == 0) {
    resizable_tensor::copy_size(&this->v,params_grad);
    iVar7 = (*(this->v).super_tensor._vptr_tensor[4])();
    lVar2 = (this->v).super_tensor.m_size;
    if (lVar2 != 0) {
      memset((void *)CONCAT44(extraout_var,iVar7),0,lVar2 << 2);
    }
  }
  auVar10._8_8_ = 0;
  auVar10._0_8_ = l->weight_decay_multiplier;
  dVar3 = (double)learning_rate * l->learning_rate_multiplier;
  auVar9._12_4_ = 0x80000000;
  auVar9._0_12_ = ZEXT812(0x8000000000000000);
  auVar9 = vxorpd_avx512vl(auVar10,auVar9);
  dVar4 = auVar9._0_8_ * (double)this->weight_decay;
  auVar11._0_4_ = (float)dVar3;
  auVar11._4_4_ = (int)((ulong)dVar3 >> 0x20);
  auVar11._8_8_ = 0;
  auVar5._8_4_ = 0x80000000;
  auVar5._0_8_ = 0x8000000080000000;
  auVar5._12_4_ = 0x80000000;
  auVar9 = vxorps_avx512vl(auVar11,auVar5);
  B = (float)(dVar3 * dVar4);
  if ((((l->bias_learning_rate_multiplier == 1.0) && (!NAN(l->bias_learning_rate_multiplier))) &&
      (l->bias_weight_decay_multiplier == 1.0)) && (!NAN(l->bias_weight_decay_multiplier))) {
    tt::affine_transform
              ((tensor *)this,(tensor *)this,(tensor *)l,params_grad,this->momentum,B,auVar9._0_4_);
    return;
  }
  tt::affine_transform_range
            (0,bias_offset,(tensor *)this,(tensor *)this,(tensor *)l,params_grad,this->momentum,B,
             auVar9._0_4_);
  dVar3 = dVar3 * l->bias_learning_rate_multiplier;
  auVar12._0_4_ = (float)dVar3;
  auVar12._4_4_ = (int)((ulong)dVar3 >> 0x20);
  auVar12._8_8_ = 0;
  auVar6._8_4_ = 0x80000000;
  auVar6._0_8_ = 0x8000000080000000;
  auVar6._12_4_ = 0x80000000;
  auVar9 = vxorps_avx512vl(auVar12,auVar6);
  tt::affine_transform_range
            (bias_offset,(this->v).super_tensor.m_size,(tensor *)this,(tensor *)this,(tensor *)l,
             params_grad,this->momentum,(float)(dVar3 * dVar4 * l->bias_weight_decay_multiplier),
             auVar9._0_4_);
  return;
}

Assistant:

void update_considering_bias(
            const float learning_rate,
            const layer_type& l,
            const tensor& params_grad,
            unsigned long bias_offset
        )
        {
            const tensor& params = l.get_layer_params();

            DLIB_CASSERT(params.size() != 0);
            if (v.size() == 0)
            {
                v.copy_size(params_grad);
                v = 0;
            }

            double lr = learning_rate*get_learning_rate_multiplier(l);
            double wd = weight_decay*get_weight_decay_multiplier(l);
            
            //perform: v = momentum*mat(v) - wd*lr*mat(params) - lr*mat(params_grad);

            if (l.get_bias_learning_rate_multiplier() == 1 && l.get_bias_weight_decay_multiplier() == 1)
            {
                tt::affine_transform(v, v, params, params_grad, momentum, -wd*lr, -lr);
            }
            else
            {

                tt::affine_transform_range(0, bias_offset, v, v, params, params_grad, momentum, -wd*lr, -lr);

                // now update the biases but apply their multipliers
                lr *= l.get_bias_learning_rate_multiplier();
                wd *= l.get_bias_weight_decay_multiplier();
                tt::affine_transform_range(bias_offset, v.size(), v, v, params, params_grad, momentum, -wd*lr, -lr);
            }
        }